

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.hpp
# Opt level: O0

void __thiscall
Lib::Exception::Exception<char_const*,std::__cxx11::string,char_const*>
          (Exception *this,char *msg,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *msg_1,char *msg_2)

{
  Exception *in_RDX;
  char *in_stack_00000140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000148;
  char *in_stack_00000150;
  Exception *in_stack_00000158;
  string *in_stack_ffffffffffffff68;
  string local_60 [32];
  string local_40 [64];
  
  std::__cxx11::string::string(local_60,(string *)in_RDX);
  toString<char_const*,std::__cxx11::string,char_const*>
            (in_stack_00000158,in_stack_00000150,in_stack_00000148,in_stack_00000140);
  Exception(in_RDX,in_stack_ffffffffffffff68);
  std::__cxx11::string::~string(local_40);
  std::__cxx11::string::~string(local_60);
  return;
}

Assistant:

explicit Exception(Msg... msg)
   : Exception(toString(msg...))
  { }